

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::argHelp(QPDFArgParser *this,string *p)

{
  element_type *this_00;
  string local_48;
  shared_ptr<QPDFLogger> local_28;
  string *local_18;
  string *p_local;
  QPDFArgParser *this_local;
  
  local_18 = p;
  p_local = (string *)this;
  QPDFLogger::defaultLogger();
  this_00 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &local_28);
  getHelp(&local_48,this,local_18);
  QPDFLogger::info(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_28);
  exit(0);
}

Assistant:

void
QPDFArgParser::argHelp(std::string const& p)
{
    QPDFLogger::defaultLogger()->info(getHelp(p));
    exit(0);
}